

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O3

size_t __thiscall
QPDF::recoverStreamLength
          (QPDF *this,shared_ptr<InputSource> *input,QPDFObjGen og,qpdf_offset_t stream_offset)

{
  InputSource *pIVar1;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var2;
  char cVar3;
  bool bVar4;
  int iVar5;
  qpdf_offset_t qVar6;
  _Base_ptr p_Var7;
  long *plVar8;
  unsigned_long uVar9;
  size_type *psVar10;
  long lVar11;
  ulong uVar12;
  char cVar13;
  unsigned_long uVar14;
  ulong uVar15;
  _Base_ptr p_Var16;
  PatternFinder ef;
  Token t;
  string local_140;
  unsigned_long local_120;
  QPDFObjGen local_118;
  shared_ptr<InputSource> *local_110;
  long local_108;
  QPDF *local_100;
  ulong local_f8;
  undefined1 local_f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  long *local_d0;
  uint local_c8;
  long local_c0 [2];
  undefined1 local_b0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58 [2];
  
  pIVar1 = (input->super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_118 = og;
  local_f0._0_8_ = &local_e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f0,"attempting to recover stream length","");
  damagedPDF((QPDFExc *)local_b0,this,pIVar1,stream_offset,(string *)local_f0);
  warn(this,(QPDFExc *)local_b0);
  local_110 = input;
  QPDFExc::~QPDFExc((QPDFExc *)local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._0_8_ != &local_e0) {
    operator_delete((void *)local_f0._0_8_,local_e0._M_allocated_capacity + 1);
  }
  local_f0._0_8_ = &PTR__Finder_002f4b38;
  local_e0._M_allocated_capacity = (size_type)findEndstream;
  local_e0._8_8_ = 0;
  local_f0._8_8_ = this;
  bVar4 = InputSource::findFirst
                    ((((this->m)._M_t.
                       super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                     super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr,"end",
                     stream_offset,0,(Finder *)local_f0);
  if (bVar4) {
    local_108 = (**(code **)(**(long **)&(((this->m)._M_t.
                                           super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                           .super__Head_base<0UL,_QPDF::Members_*,_false>.
                                          _M_head_impl)->file).
                                         super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>
                            + 0x20))();
    uVar14 = local_108 - stream_offset;
    if ((long)uVar14 < 0) {
      QIntC::IntConverter<long_long,_unsigned_long,_true,_false>::error(uVar14);
    }
    _Var2._M_head_impl =
         (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
         _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    ::qpdf::Tokenizer::readToken
              ((Token *)local_b0,&(_Var2._M_head_impl)->tokenizer,
               ((_Var2._M_head_impl)->file).
               super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &(_Var2._M_head_impl)->last_object_description,true,0);
    iVar5 = std::__cxx11::string::compare(local_b0 + 8);
    if (iVar5 == 0) {
      pIVar1 = (((this->m)._M_t.
                 super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                 super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                 super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
               super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      qVar6 = InputSource::getLastOffset(pIVar1);
      (*pIVar1->_vptr_InputSource[5])(pIVar1,qVar6,0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_allocated_capacity != local_58) {
      operator_delete((void *)local_68._M_allocated_capacity,local_58[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_allocated_capacity != &local_78) {
      operator_delete((void *)local_88._M_allocated_capacity,
                      (ulong)(local_78._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._8_8_ != &local_98) {
      operator_delete((void *)local_b0._8_8_,(ulong)(local_98._M_allocated_capacity + 1));
    }
    local_f8 = (ulong)local_118 >> 0x20;
    local_120 = uVar14;
    if (uVar14 != 0) {
      if ((long)uVar14 < 0) {
        QIntC::IntConverter<unsigned_long,_long_long,_false,_true>::error(uVar14);
      }
      _Var2._M_head_impl =
           (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
           _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
           super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
      p_Var7 = ((_Var2._M_head_impl)->xref_table)._M_t._M_impl.super__Rb_tree_header._M_header.
               _M_left;
      p_Var16 = &((_Var2._M_head_impl)->xref_table)._M_t._M_impl.super__Rb_tree_header._M_header;
      if (p_Var7 != p_Var16) {
        lVar11 = 0;
        uVar15 = 0;
        uVar12 = 0;
        local_100 = this;
        do {
          iVar5 = QPDFXRefEntry::getType((QPDFXRefEntry *)&p_Var7[1]._M_parent);
          if (((iVar5 == 1) &&
              (qVar6 = QPDFXRefEntry::getOffset((QPDFXRefEntry *)&p_Var7[1]._M_parent),
              lVar11 < qVar6)) && (qVar6 < local_108)) {
            uVar12 = *(ulong *)(p_Var7 + 1);
            uVar15 = uVar12 >> 0x20;
            lVar11 = qVar6;
          }
          p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
        } while (p_Var7 != p_Var16);
        this = local_100;
        if ((lVar11 != 0) && (((int)uVar12 != local_118.obj || ((int)uVar15 != (int)local_f8))))
        goto LAB_00230250;
      }
      uVar14 = local_120;
      cVar13 = '\x01';
      if (9 < local_120) {
        uVar9 = local_120;
        cVar3 = '\x04';
        do {
          cVar13 = cVar3;
          if (uVar9 < 100) {
            cVar13 = cVar13 + -2;
            goto LAB_002302e7;
          }
          if (uVar9 < 1000) {
            cVar13 = cVar13 + -1;
            goto LAB_002302e7;
          }
          if (uVar9 < 10000) goto LAB_002302e7;
          bVar4 = 99999 < uVar9;
          uVar9 = uVar9 / 10000;
          cVar3 = cVar13 + '\x04';
        } while (bVar4);
        cVar13 = cVar13 + '\x01';
      }
LAB_002302e7:
      pIVar1 = (local_110->super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_d0 = local_c0;
      std::__cxx11::string::_M_construct((ulong)&local_d0,cVar13);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_d0,local_c8,uVar14);
      plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,0x2838b7);
      psVar10 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_140.field_2._M_allocated_capacity = *psVar10;
        local_140.field_2._8_8_ = plVar8[3];
        local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
      }
      else {
        local_140.field_2._M_allocated_capacity = *psVar10;
        local_140._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_140._M_string_length = plVar8[1];
      *plVar8 = (long)psVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      damagedPDF((QPDFExc *)local_b0,this,pIVar1,stream_offset,&local_140);
      warn(this,(QPDFExc *)local_b0);
      QPDFExc::~QPDFExc((QPDFExc *)local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
      if (local_d0 == local_c0) {
        return uVar14;
      }
      operator_delete(local_d0,local_c0[0] + 1);
      return uVar14;
    }
  }
LAB_00230250:
  pIVar1 = (local_110->super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_140,"unable to recover stream data; treating stream as empty","");
  damagedPDF((QPDFExc *)local_b0,this,pIVar1,stream_offset,&local_140);
  warn(this,(QPDFExc *)local_b0);
  QPDFExc::~QPDFExc((QPDFExc *)local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

size_t
QPDF::recoverStreamLength(
    std::shared_ptr<InputSource> input, QPDFObjGen og, qpdf_offset_t stream_offset)
{
    // Try to reconstruct stream length by looking for endstream or endobj
    warn(damagedPDF(*input, stream_offset, "attempting to recover stream length"));

    PatternFinder ef(*this, &QPDF::findEndstream);
    size_t length = 0;
    if (m->file->findFirst("end", stream_offset, 0, ef)) {
        length = toS(m->file->tell() - stream_offset);
        // Reread endstream but, if it was endobj, don't skip that.
        QPDFTokenizer::Token t = readToken(*m->file);
        if (t.getValue() == "endobj") {
            m->file->seek(m->file->getLastOffset(), SEEK_SET);
        }
    }

    if (length) {
        auto end = stream_offset + toO(length);
        qpdf_offset_t found_offset = 0;
        QPDFObjGen found_og;

        // Make sure this is inside this object
        for (auto const& [current_og, entry]: m->xref_table) {
            if (entry.getType() == 1) {
                qpdf_offset_t obj_offset = entry.getOffset();
                if (found_offset < obj_offset && obj_offset < end) {
                    found_offset = obj_offset;
                    found_og = current_og;
                }
            }
        }
        if (!found_offset || found_og == og) {
            // If we are trying to recover an XRef stream the xref table will not contain and
            // won't contain any entries, therefore we cannot check the found length. Otherwise we
            // found endstream\nendobj within the space allowed for this object, so we're probably
            // in good shape.
        } else {
            QTC::TC("qpdf", "QPDF found wrong endstream in recovery");
            length = 0;
        }
    }

    if (length == 0) {
        warn(damagedPDF(
            *input, stream_offset, "unable to recover stream data; treating stream as empty"));
    } else {
        warn(damagedPDF(
            *input, stream_offset, "recovered stream length: " + std::to_string(length)));
    }

    QTC::TC("qpdf", "QPDF recovered stream length");
    return length;
}